

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O3

void __thiscall Liby::EventLoop::EventLoop(EventLoop *this,string *chooser)

{
  _Head_base<0UL,_Liby::Poller_*,_false> _Var1;
  int iVar2;
  _Head_base<0UL,_Liby::Poller_*,_false> _Var3;
  EventQueue *this_00;
  TimerQueue *this_01;
  
  memset(this,0,0xa8);
  std::_Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::
  _M_initialize_map(&(this->nextLoopHandlers_).
                     super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                    ,0);
  (this->afterLoopHandlers_).
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->afterLoopHandlers_).
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->afterLoopHandlers_).
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->afterLoopHandlers_).
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->afterLoopHandlers_).
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->afterLoopHandlers_).
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->afterLoopHandlers_).
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->afterLoopHandlers_).
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->afterLoopHandlers_).
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->afterLoopHandlers_).
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::
  _M_initialize_map(&(this->afterLoopHandlers_).
                     super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                    ,0);
  iVar2 = std::__cxx11::string::compare((char *)chooser);
  if (iVar2 == 0) {
    _Var3._M_head_impl = (Poller *)operator_new(0x80);
    PollerPoll::PollerPoll((PollerPoll *)_Var3._M_head_impl);
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)chooser);
    if (iVar2 == 0) {
      _Var3._M_head_impl = (Poller *)operator_new(0x1f0);
      PollerSelect::PollerSelect((PollerSelect *)_Var3._M_head_impl);
    }
    else {
      _Var3._M_head_impl = (Poller *)operator_new(0xa0);
      PollerEpoll::PollerEpoll((PollerEpoll *)_Var3._M_head_impl);
    }
  }
  _Var1._M_head_impl =
       (this->poller_)._M_t.super___uniq_ptr_impl<Liby::Poller,_std::default_delete<Liby::Poller>_>.
       _M_t.super__Tuple_impl<0UL,_Liby::Poller_*,_std::default_delete<Liby::Poller>_>.
       super__Head_base<0UL,_Liby::Poller_*,_false>._M_head_impl;
  (this->poller_)._M_t.super___uniq_ptr_impl<Liby::Poller,_std::default_delete<Liby::Poller>_>._M_t.
  super__Tuple_impl<0UL,_Liby::Poller_*,_std::default_delete<Liby::Poller>_>.
  super__Head_base<0UL,_Liby::Poller_*,_false>._M_head_impl = _Var3._M_head_impl;
  if (_Var1._M_head_impl != (Poller *)0x0) {
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_Poller + 8))();
  }
  _Var3._M_head_impl =
       (this->poller_)._M_t.super___uniq_ptr_impl<Liby::Poller,_std::default_delete<Liby::Poller>_>.
       _M_t.super__Tuple_impl<0UL,_Liby::Poller_*,_std::default_delete<Liby::Poller>_>.
       super__Head_base<0UL,_Liby::Poller_*,_false>._M_head_impl;
  this_00 = (EventQueue *)operator_new(0x90);
  EventQueue::EventQueue(this_00,_Var3._M_head_impl);
  std::__uniq_ptr_impl<Liby::EventQueue,_std::default_delete<Liby::EventQueue>_>::reset
            ((__uniq_ptr_impl<Liby::EventQueue,_std::default_delete<Liby::EventQueue>_> *)
             &this->equeue_,this_00);
  _Var3._M_head_impl =
       (this->poller_)._M_t.super___uniq_ptr_impl<Liby::Poller,_std::default_delete<Liby::Poller>_>.
       _M_t.super__Tuple_impl<0UL,_Liby::Poller_*,_std::default_delete<Liby::Poller>_>.
       super__Head_base<0UL,_Liby::Poller_*,_false>._M_head_impl;
  this_01 = (TimerQueue *)operator_new(0x48);
  TimerQueue::TimerQueue(this_01,_Var3._M_head_impl);
  std::__uniq_ptr_impl<Liby::TimerQueue,_std::default_delete<Liby::TimerQueue>_>::reset
            ((__uniq_ptr_impl<Liby::TimerQueue,_std::default_delete<Liby::TimerQueue>_> *)
             &this->tqueue_,this_01);
  return;
}

Assistant:

EventLoop::EventLoop(const std::string &chooser) {
    if (chooser == "POLL") {
        poller_ = std::make_unique<PollerPoll>();
    } else if (chooser == "SELECT") {
        poller_ = std::make_unique<PollerSelect>();
    } else {
#ifdef __linux__
        poller_ = std::make_unique<PollerEpoll>();
#elif defined(__APPLE__)
        poller_ = std::make_unique<PollerKevent>();
#endif
    }

    equeue_ = std::make_unique<EventQueue>(poller_.get());
    tqueue_ = std::make_unique<TimerQueue>(poller_.get());
}